

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.h
# Opt level: O1

void __thiscall
TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_>::CopyFrom
          (TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> *this,
          TPZMatrix<double> *mat)

{
  int64_t iVar1;
  STensorProductMTData *pSVar2;
  undefined4 uVar3;
  TPZMatrix<double> *cp;
  
  if (mat == (TPZMatrix<double> *)0x0) {
    cp = (TPZMatrix<double> *)0x0;
  }
  else {
    cp = (TPZMatrix<double> *)
         __dynamic_cast(mat,&TPZMatrix<double>::typeinfo,
                        &TPZFrontMatrix<double,TPZStackEqnStorage<double>,TPZFrontNonSym<double>>::
                         typeinfo,0);
  }
  if (cp != (TPZMatrix<double> *)0x0) {
    TPZMatrix<double>::operator=((TPZMatrix<double> *)this,cp);
    TPZManVector<TPZEqnArray<double>,_10>::operator=
              (&(this->fStorage).fEqnStack.super_TPZManVector<TPZEqnArray<double>,_10>,
               (TPZManVector<TPZEqnArray<double>,_10> *)&cp[1].super_TPZBaseMatrix.fRow);
    uVar3 = *(undefined4 *)((long)&cp[0xfcf].super_TPZBaseMatrix.fCol + 4);
    (this->fFront).super_TPZFront<double>.fWork = *(undefined4 *)&cp[0xfcf].super_TPZBaseMatrix.fCol
    ;
    (this->fFront).super_TPZFront<double>.fMaxFront = uVar3;
    TPZManVector<long,_10>::operator=
              (&(this->fFront).super_TPZFront<double>.fGlobal,
               (TPZManVector<long,_10> *)&cp[0xfcf].super_TPZBaseMatrix.fDecomposed);
    TPZVec<long>::operator=
              (&(this->fFront).super_TPZFront<double>.fLocal,
               (TPZVec<long> *)&cp[0xfd3].super_TPZBaseMatrix.fRow);
    iVar1 = cp[0xfd4].super_TPZBaseMatrix.fCol;
    (this->fFront).super_TPZFront<double>.fFront = cp[0xfd4].super_TPZBaseMatrix.fRow;
    (this->fFront).super_TPZFront<double>.fNextRigidBodyMode = iVar1;
    TPZManVector<int,_10>::operator=
              (&(this->fFront).super_TPZFront<double>.fFree.super_TPZManVector<int,_10>,
               (TPZManVector<int,_10> *)&cp[0xfd4].super_TPZBaseMatrix.fDecomposed);
    TPZVec<double>::operator=
              (&(this->fFront).super_TPZFront<double>.fData,(TPZVec<double> *)(cp + 0xfd7));
    pSVar2 = (STensorProductMTData *)cp[0xfd8].super_TPZBaseMatrix.fRow;
    *(_func_int ***)&(this->fFront).super_TPZFront<double>.fExpandRatio =
         cp[0xfd8].super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable;
    (this->fFront).super_TPZFront<double>.fProductMTData = pSVar2;
    iVar1 = *(int64_t *)&cp[0xfd8].super_TPZBaseMatrix.fDecomposed;
    this->fNumEq = cp[0xfd8].super_TPZBaseMatrix.fCol;
    this->fLastDecomposed = iVar1;
    TPZVec<int>::operator=(&this->fNumElConnected,(TPZVec<int> *)(cp + 0xfd9));
    TPZVec<int>::operator=(&this->fNumElConnectedBackup,(TPZVec<int> *)(cp + 0xfda));
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "virtual void TPZFrontMatrix<double, TPZStackEqnStorage<double>, TPZFrontNonSym<double>>::CopyFrom(const TPZMatrix<TVar> *) [TVar = double, store = TPZStackEqnStorage<double>, front = TPZFrontNonSym<double>]"
             ,0xce);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\nERROR: Called with incompatible type\n.",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Aborting...\n",0xc);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/TPZFrontMatrix.h"
             ,0xb6);
}

Assistant:

void CopyFrom(const TPZMatrix<TVar> *  mat) override        
  {                                                           
    auto *from = dynamic_cast<const TPZFrontMatrix<TVar,store,front> *>(mat);                
    if (from) {                                               
      *this = *from;                                          
    }                                                         
    else                                                      
      {                                                       
        PZError<<__PRETTY_FUNCTION__;                         
        PZError<<"\nERROR: Called with incompatible type\n."; 
        PZError<<"Aborting...\n";                             
        DebugStop();                                          
      }                                                       
  }